

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O2

pointer __thiscall
gmlc::networking::establishConnection
          (networking *this,SocketFactory *sf,io_context *io_context,string *host,string *port,
          milliseconds timeOut)

{
  bool bVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint uVar4;
  pointer pcVar5;
  milliseconds mVar6;
  pointer pVar7;
  duration<long,_std::ratio<1L,_1000L>_> local_78;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  io_context *local_50;
  string *local_48;
  string *local_40;
  milliseconds local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sf;
  local_50 = io_context;
  local_48 = host;
  local_40 = port;
  TcpConnection::create((TcpConnection *)&stack0xffffffffffffff88,sf,io_context,host,port,0x27d0);
  std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffff88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff90);
  _Var3._M_pi = extraout_RDX;
  if (0 < timeOut.__r) {
    local_60 = (element_type *)std::chrono::_V2::steady_clock::now();
    uVar4 = 1;
    mVar6.__r = timeOut.__r;
    local_38.__r = timeOut.__r;
    while( true ) {
      bVar1 = TcpConnection::waitUntilConnected(*(TcpConnection **)this,timeOut);
      pcVar5 = (pointer)local_38.__r;
      _Var3._M_pi = extraout_RDX_00;
      if (bVar1) break;
      lVar2 = std::chrono::_V2::steady_clock::now();
      pcVar5 = pcVar5 + (lVar2 - (long)local_60) / -1000000;
      if (1 < uVar4 && (long)pcVar5 < 0) {
        local_78.__r = 0;
        _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this
                   ,(__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                    &stack0xffffffffffffff88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff90);
        _Var3._M_pi = extraout_RDX_01;
        break;
      }
      if (mVar6.__r - (long)pcVar5 < 100) {
        local_78.__r = (rep)&DAT_000000c8;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&stack0xffffffffffffff88);
      }
      TcpConnection::create
                ((TcpConnection *)&stack0xffffffffffffff88,(SocketFactory *)local_58._M_pi,local_50,
                 local_48,local_40,0x27d0);
      timeOut.__r = (rep)(pointer)0x190;
      if (-1 < (long)pcVar5) {
        timeOut.__r = (rep)pcVar5;
      }
      uVar4 = uVar4 + 1;
      std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffff88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff90);
      mVar6.__r = (rep)pcVar5;
    }
  }
  pVar7.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  pVar7.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar7.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& host,
    const std::string& port,
    std::chrono::milliseconds timeOut)
{
    using std::chrono::milliseconds;
    using std::chrono::steady_clock;

    using namespace std::chrono_literals;  // NOLINT

    TcpConnection::pointer connectionPtr;
    connectionPtr = TcpConnection::create(sf, io_context, host, port);
    if (timeOut <= std::chrono::milliseconds(0)) {
        return connectionPtr;
    }

    auto tick = steady_clock::now();
    milliseconds timeRemaining(timeOut);
    milliseconds timeRemPrev(timeOut);
    int trycnt = 1;
    while (!connectionPtr->waitUntilConnected(timeRemaining)) {
        auto tock = steady_clock::now();
        timeRemaining = milliseconds(timeOut) -
            std::chrono::duration_cast<milliseconds>(tock - tick);
        if ((timeRemaining < 0ms) && (trycnt > 1)) {
            connectionPtr = nullptr;
            break;
        }
        // make sure we slow down and sleep for a little bit
        if (timeRemPrev - timeRemaining < 100ms) {
            std::this_thread::sleep_for(200ms);
        }
        timeRemPrev = timeRemaining;
        if (timeRemaining < 0ms) {
            timeRemaining = 400ms;
        }

        // lets try to connect again
        ++trycnt;
        connectionPtr = TcpConnection::create(sf, io_context, host, port);
    }
    return connectionPtr;
}